

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::action_repr::action_repr(action_repr *this,action _a,features *_repr)

{
  features *src;
  long in_RDX;
  undefined4 in_ESI;
  features *in_RDI;
  
  *(undefined4 *)&(in_RDI->values)._begin = in_ESI;
  if (in_RDX == 0) {
    (in_RDI->values)._end = (float *)0x0;
  }
  else {
    src = (features *)operator_new(0x68);
    features::features((features *)this);
    (in_RDI->values)._end = (float *)src;
    features::deep_copy_from(in_RDI,src);
  }
  return;
}

Assistant:

action_repr(action _a, features* _repr) : a(_a)
  {
    if (_repr != nullptr)
    {
      repr = new features();
      repr->deep_copy_from(*_repr);
    }
    else
      repr = nullptr;
  }